

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-close-stdout-read-stdin.c
# Opt level: O1

int run_test_pipe_close_stdout_read_stdin(void)

{
  int iVar1;
  uint __pid;
  ssize_t sVar2;
  uint *__pipedes;
  undefined8 uVar3;
  char buf;
  int fd [2];
  int status;
  undefined1 local_121;
  uint local_120;
  int local_11c;
  uint local_118 [66];
  
  __pipedes = &local_120;
  iVar1 = pipe((int *)__pipedes);
  if (iVar1 == 0) {
    __pid = fork();
    close(local_11c);
    __pipedes = (uint *)(ulong)local_120;
    if (__pid != 0) {
      close(local_120);
      __pipedes = (uint *)(ulong)__pid;
      waitpid(__pid,(int *)local_118,0);
      if (((ushort)local_118[0] & 0xff7f) != 0) {
        run_test_pipe_close_stdout_read_stdin_cold_2();
        goto LAB_001650b6;
      }
LAB_0016514b:
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      __pipedes = (uint *)uv_default_loop();
      iVar1 = uv_loop_close(__pipedes);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00165191;
    }
LAB_001650b6:
    sVar2 = read((int)__pipedes,&local_121,1);
    if (2 < (int)sVar2 + 1U) goto LAB_00165196;
    close(0);
    __pipedes = (uint *)(ulong)local_120;
    iVar1 = dup(local_120);
    if (iVar1 == -1) goto LAB_0016519b;
    __pipedes = (uint *)uv_default_loop();
    iVar1 = uv_pipe_init(__pipedes,local_118,0);
    if (iVar1 != 0) goto LAB_001651a0;
    __pipedes = local_118;
    iVar1 = uv_pipe_open(__pipedes,0);
    if (iVar1 != 0) goto LAB_001651a5;
    __pipedes = local_118;
    iVar1 = uv_read_start(__pipedes,alloc_buffer,read_stdin);
    if (iVar1 == 0) {
      __pipedes = (uint *)uv_default_loop();
      iVar1 = uv_run(__pipedes,2);
      if (iVar1 != 0) goto LAB_001651af;
      goto LAB_0016514b;
    }
  }
  else {
    run_test_pipe_close_stdout_read_stdin_cold_1();
LAB_00165191:
    run_test_pipe_close_stdout_read_stdin_cold_8();
LAB_00165196:
    run_test_pipe_close_stdout_read_stdin_cold_3();
LAB_0016519b:
    run_test_pipe_close_stdout_read_stdin_cold_9();
LAB_001651a0:
    run_test_pipe_close_stdout_read_stdin_cold_4();
LAB_001651a5:
    run_test_pipe_close_stdout_read_stdin_cold_5();
  }
  run_test_pipe_close_stdout_read_stdin_cold_6();
LAB_001651af:
  run_test_pipe_close_stdout_read_stdin_cold_7();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(__pipedes,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_close_stdout_read_stdin) {
  int r = -1;
  int pid;
  int fd[2];
  int status;
  char buf;
  uv_pipe_t stdin_pipe;

  r = pipe(fd);
  ASSERT(r == 0);

  if ((pid = fork()) == 0) {
    /*
     * Make the read side of the pipe our stdin.
     * The write side will be closed by the parent process.
    */
    close(fd[1]);
    /* block until write end of pipe is closed */
    r = read(fd[0], &buf, 1);
    ASSERT(-1 <= r && r <= 1);
    close(0);
    r = dup(fd[0]);
    ASSERT(r != -1);

    /* Create a stream that reads from the pipe. */
    r = uv_pipe_init(uv_default_loop(), (uv_pipe_t *)&stdin_pipe, 0);
    ASSERT(r == 0);

    r = uv_pipe_open((uv_pipe_t *)&stdin_pipe, 0);
    ASSERT(r == 0);

    r = uv_read_start((uv_stream_t *)&stdin_pipe, alloc_buffer, read_stdin);
    ASSERT(r == 0);

    /*
     * Because the other end of the pipe was closed, there should
     * be no event left to process after one run of the event loop.
     * Otherwise, it means that events were not processed correctly.
     */
    ASSERT(uv_run(uv_default_loop(), UV_RUN_NOWAIT) == 0);
  } else {
    /*
     * Close both ends of the pipe so that the child
     * get a POLLHUP event when it tries to read from
     * the other end.
     */
     close(fd[1]);
     close(fd[0]);

    waitpid(pid, &status, 0);
    ASSERT(WIFEXITED(status) && WEXITSTATUS(status) == 0);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}